

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDToBrepParameters::Read(ON_SubDToBrepParameters *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  VertexProcess VVar2;
  uint local_2c;
  bool local_26;
  VertexProcess exvtx;
  uint u;
  bool bPackFaces;
  bool rc;
  ON_BinaryArchive *pOStack_20;
  int version;
  ON_BinaryArchive *archive_local;
  ON_SubDToBrepParameters *this_local;
  
  this->m_bPackFaces = false;
  this->m_extraordinary_vertex_process = LocalG1x;
  this->m_reserved1 = 0;
  this->m_reserved2 = 0;
  this->m_reserved3 = 0.0;
  u = 0;
  pOStack_20 = archive;
  archive_local = (ON_BinaryArchive *)this;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,(int *)&u);
  if (bVar1) {
    exvtx = None;
    if (0 < (int)u) {
      local_26 = PackFaces(this);
      bVar1 = ON_BinaryArchive::ReadBool(pOStack_20,&local_26);
      if (bVar1) {
        SetPackFaces(this,(bool)(local_26 & 1));
        VVar2 = ExtraordinaryVertexProcess(this);
        local_2c = (uint)VVar2;
        bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&local_2c);
        if (bVar1) {
          VVar2 = VertexProcessFromUnsigned(local_2c);
          SetExtraordinaryVertexProcess(this,VVar2);
          exvtx = LocalG1;
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_20);
    if (!bVar1) {
      exvtx = None;
    }
    this_local._7_1_ = (bool)(exvtx & LocalG1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDToBrepParameters::Read(ON_BinaryArchive& archive)
{
  *this = ON_SubDToBrepParameters::Default;
  int version = 0;
  if (false == archive.BeginRead3dmAnonymousChunk(&version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (version < 1)
      break;

    bool bPackFaces = this->PackFaces();
    if (false == archive.ReadBool(&bPackFaces))
      break;
    this->SetPackFaces(bPackFaces);

    unsigned u = static_cast<unsigned char>(this->ExtraordinaryVertexProcess());
    if (false == archive.ReadInt(&u))
      break;
    ON_SubDToBrepParameters::VertexProcess exvtx = ON_SubDToBrepParameters::VertexProcessFromUnsigned(u);
    this->SetExtraordinaryVertexProcess(exvtx);

    rc = true;
    break;
  }

  if (false == archive.EndRead3dmChunk())
    rc = false;
  return rc;
}